

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  ImU32 col;
  ImU32 col_00;
  ImGuiCol idx;
  bool bVar6;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  uint in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  undefined1 auVar13 [12];
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  bool held;
  bool hovered;
  bool local_ca;
  bool local_c9;
  ImRect local_c8;
  float local_b8;
  float local_b4;
  float local_b0;
  ImDrawCornerFlags local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  ImVec2 *local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar18 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar19 = (bb_frame->Max).y - (bb_frame->Min).y;
    if (fVar18 <= 0.0) {
      return false;
    }
    if (fVar19 <= 0.0) {
      return false;
    }
    local_b4 = 1.0;
    if (axis == ImGuiAxis_Y) {
      fVar9 = (GImGui->Style).FramePadding.y;
      fVar9 = fVar9 + fVar9;
      if (fVar19 < fVar9 + GImGui->FontSize) {
        fVar9 = (fVar19 - GImGui->FontSize) / fVar9;
        local_b4 = 1.0;
        if (fVar9 <= 1.0) {
          local_b4 = fVar9;
        }
        local_b4 = (float)(~-(uint)(fVar9 < 0.0) & (uint)local_b4);
      }
    }
    if (0.0 < local_b4) {
      iVar12 = (int)((fVar18 + -2.0) * 0.5);
      iVar17 = (int)((fVar19 + -2.0) * 0.5);
      auVar10._0_4_ = -(uint)(iVar12 < 0);
      auVar10._4_4_ = -(uint)(iVar17 < 0);
      auVar10._8_8_ = 0;
      auVar14._0_4_ = -(uint)(3 < iVar12);
      auVar14._4_4_ = -(uint)(3 < iVar17);
      auVar14._8_8_ = 0;
      auVar11._0_8_ = CONCAT44((float)iVar17,(float)iVar12) ^ 0x8000000080000000;
      auVar11._8_4_ = 0x80000000;
      auVar11._12_4_ = 0x80000000;
      auVar11 = auVar10 & _DAT_002cc790 | ~auVar10 & (auVar14 & _DAT_002cc780 | ~auVar14 & auVar11);
      fStack_80 = auVar11._0_4_;
      fVar19 = auVar11._4_4_;
      auVar15._0_8_ = auVar11._0_8_;
      auVar15._8_4_ = fStack_80;
      auVar15._12_4_ = fVar19;
      local_c8.Min.x = (bb_frame->Min).x;
      local_c8.Min.y = (bb_frame->Min).y;
      local_c8.Max.x = (bb_frame->Max).x;
      local_c8.Max.y = (bb_frame->Max).y;
      local_88 = local_c8.Min.x - fStack_80;
      fVar18 = local_c8.Min.y - fVar19;
      fStack_80 = local_c8.Max.x + fStack_80;
      fStack_84 = local_c8.Max.y + fVar19;
      auVar3._4_8_ = auVar15._8_8_;
      auVar3._0_4_ = local_c8.Min.y + fVar19;
      auVar16._0_8_ = auVar3._0_8_ << 0x20;
      auVar16._8_4_ = fStack_80;
      auVar16._12_4_ = fStack_84;
      local_c8.Max = auVar16._8_8_;
      local_c8.Min.y = fVar18;
      local_c8.Min.x = local_88;
      local_a8._4_4_ = in_XMM1_Db;
      local_a8._0_4_ = size_contents_v;
      local_a8._8_4_ = in_XMM1_Dc;
      local_a8._12_4_ = in_XMM1_Dd;
      if (axis != ImGuiAxis_X) {
        fStack_80 = fStack_84;
        local_88 = fVar18;
      }
      local_88 = fStack_80 - local_88;
      local_60 = &bb_frame->Max;
      local_98 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
      local_ca = false;
      local_c9 = false;
      local_ac = rounding_corners;
      fStack_7c = fStack_84;
      local_78 = size_avail_v;
      uStack_74 = in_XMM0_Db;
      uStack_70 = in_XMM0_Dc;
      uStack_6c = in_XMM0_Dd;
      ButtonBehavior(&local_c8,id,&local_c9,&local_ca,0x40000);
      fVar18 = (float)(~-(uint)(local_78 <= (float)local_a8._0_4_) & (uint)local_78 |
                      -(uint)(local_78 <= (float)local_a8._0_4_) & local_a8._0_4_);
      if (fVar18 <= 1.0) {
        fVar18 = 1.0;
      }
      fVar19 = (local_78 / fVar18) * local_88;
      fVar18 = local_88;
      if (fVar19 <= local_88) {
        fVar18 = fVar19;
      }
      fVar19 = (float)(-(uint)(fVar19 < (float)local_98._0_4_) & local_98._0_4_ |
                      ~-(uint)(fVar19 < (float)local_98._0_4_) & (uint)fVar18);
      uStack_74 = uStack_74 & local_98._4_4_ | ~uStack_74 & (uint)fStack_84;
      uStack_70 = uStack_70 & local_98._8_4_ | ~uStack_70 & (uint)fStack_80;
      uStack_6c = uStack_6c & local_98._12_4_ | ~uStack_6c & (uint)fStack_7c;
      fVar18 = 1.0;
      if (1.0 <= (float)local_a8._0_4_ - local_78) {
        fVar18 = (float)local_a8._0_4_ - local_78;
      }
      fVar9 = *p_scroll_v / fVar18;
      auVar7 = ZEXT812(0x3f800000);
      if (fVar9 <= 1.0) {
        auVar7._4_8_ = 0;
        auVar7._0_4_ = fVar9;
      }
      auVar4._4_8_ = 0;
      auVar4._0_4_ = auVar7._8_4_;
      local_a8._0_4_ =
           ((float)(~-(uint)(fVar9 < 0.0) & auVar7._0_4_) * (local_88 - fVar19)) / local_88;
      local_a8._4_8_ = SUB128(auVar4 << 0x40,4);
      local_a8._12_4_ = 0;
      local_78 = fVar19;
      if (((1.0 <= local_b4) && (fVar19 / local_88 < 1.0)) && (local_ca != false)) {
        local_b8 = local_88 - fVar19;
        local_b0 = fVar18;
        local_98._4_4_ = uStack_74;
        local_98._0_4_ = fVar19 / local_88;
        local_98._8_4_ = uStack_70;
        local_98._12_4_ = uStack_6c;
        fVar18 = (*(float *)((pIVar5->IO).MouseDown + (long)axis * 4 + -8) - (&local_c8.Min.x)[axis]
                 ) / local_88;
        auVar8 = ZEXT812(0x3f800000);
        if (fVar18 <= 1.0) {
          auVar8._4_8_ = 0;
          auVar8._0_4_ = fVar18;
        }
        local_58._0_4_ = ~-(uint)(fVar18 < 0.0) & auVar8._0_4_;
        local_58._4_4_ = 0;
        local_58._8_4_ = auVar8._8_4_;
        local_58._12_4_ = 0;
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == true) {
          bVar2 = (float)local_98._0_4_ + (float)local_a8._0_4_ < (float)local_58._0_4_;
          bVar6 = bVar2 || (float)local_58._0_4_ < (float)local_a8._0_4_;
          fVar18 = 0.0;
          if (!bVar2 && (float)local_58._0_4_ >= (float)local_a8._0_4_) {
            fVar18 = (float)local_98._0_4_ * -0.5 + ((float)local_58._0_4_ - (float)local_a8._0_4_);
          }
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar18;
        }
        else {
          bVar6 = false;
        }
        auVar13 = ZEXT812(0x3f800000);
        fVar19 = (((float)local_58._0_4_ - pIVar5->ScrollbarClickDeltaToGrabCenter) -
                 (float)local_98._0_4_ * 0.5) / (1.0 - (float)local_98._0_4_);
        fVar18 = 1.0;
        if (fVar19 <= 1.0) {
          fVar18 = fVar19;
        }
        fVar18 = (float)(int)((float)(~-(uint)(fVar19 < 0.0) & (uint)fVar18) * local_b0 + 0.5);
        *p_scroll_v = fVar18;
        fVar18 = fVar18 / local_b0;
        if (fVar18 <= auVar13._0_4_) {
          auVar13._4_8_ = auVar13._4_8_;
          auVar13._0_4_ = fVar18;
        }
        fVar18 = (local_b8 * (float)(~-(uint)(fVar18 < 0.0) & auVar13._0_4_)) / local_88;
        local_a8 = ZEXT416((uint)fVar18);
        if (bVar6) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_98._0_4_ * 0.5 + ((float)local_58._0_4_ - fVar18);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_ca == false) {
        idx = (local_c9 & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_b4);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_60,col,pIVar1->WindowRounding,local_ac);
      if (axis == ImGuiAxis_X) {
        local_48.x = local_c8.Min.x + (local_c8.Max.x - local_c8.Min.x) * (float)local_a8._0_4_;
        aIStack_40[0].x = local_78 + local_48.x;
        local_48.y = local_c8.Min.y;
        aIStack_40[0].y = local_c8.Max.y;
      }
      else {
        local_48.y = (local_c8.Max.y - local_c8.Min.y) * (float)local_a8._0_4_ + local_c8.Min.y;
        aIStack_40[0].x = local_c8.Max.x;
        aIStack_40[0].y = local_78 + local_48.y;
        local_48.x = local_c8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_48,aIStack_40,col_00,(pIVar5->Style).ScrollbarRounding,0xf)
      ;
      return local_ca;
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}